

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTCreateEngine(uint32_t dwCreationFlags,FACTAudioEngine **ppEngine)

{
  FACTAudioEngine *pFVar1;
  FAudioMutex pvVar2;
  uint32_t uVar3;
  
  FAudio_PlatformAddRef();
  pFVar1 = (FACTAudioEngine *)SDL_malloc(0x110);
  *ppEngine = pFVar1;
  if (pFVar1 == (FACTAudioEngine *)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = 0;
    SDL_memset(pFVar1,0,0x110);
    pvVar2 = FAudio_PlatformCreateMutex();
    (*ppEngine)->sbLock = pvVar2;
    pvVar2 = FAudio_PlatformCreateMutex();
    (*ppEngine)->wbLock = pvVar2;
    pvVar2 = FAudio_PlatformCreateMutex();
    (*ppEngine)->apiLock = pvVar2;
    (*ppEngine)->pMalloc = SDL_malloc;
    (*ppEngine)->pFree = SDL_free;
    (*ppEngine)->pRealloc = SDL_realloc;
    (*ppEngine)->refcount = 1;
  }
  return uVar3;
}

Assistant:

uint32_t FACTCreateEngine(
	uint32_t dwCreationFlags,
	FACTAudioEngine **ppEngine
) {
	return FACTCreateEngineWithCustomAllocatorEXT(
		dwCreationFlags,
		ppEngine,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}